

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O0

void Cec3_ManPrintStats(Gia_Man_t *p,Cec3_Par_t *pPars,Cec3_Man_t *pMan)

{
  uint local_2c;
  uint local_28;
  uint local_24;
  Cec3_Man_t *pMan_local;
  Cec3_Par_t *pPars_local;
  Gia_Man_t *p_local;
  
  if (pPars->fVerbose != 0) {
    if (pMan == (Cec3_Man_t *)0x0) {
      local_24 = 0;
    }
    else {
      local_24 = pMan->nSatSat;
    }
    printf("S =%5d ",(ulong)local_24);
    if (pMan == (Cec3_Man_t *)0x0) {
      local_28 = 0;
    }
    else {
      local_28 = pMan->nSatUnsat;
    }
    printf("U =%5d ",(ulong)local_28);
    if (pMan == (Cec3_Man_t *)0x0) {
      local_2c = 0;
    }
    else {
      local_2c = pMan->nSatUndec;
    }
    printf("F =%5d ",(ulong)local_2c);
    Gia_ManEquivPrintClasses(p,pPars->fVeryVerbose,0.0);
  }
  return;
}

Assistant:

void Cec3_ManPrintStats( Gia_Man_t * p, Cec3_Par_t * pPars, Cec3_Man_t * pMan )
{
    if ( !pPars->fVerbose )
        return;
    printf( "S =%5d ", pMan ? pMan->nSatSat   : 0 );
    printf( "U =%5d ", pMan ? pMan->nSatUnsat : 0 );
    printf( "F =%5d ", pMan ? pMan->nSatUndec : 0 );
    Gia_ManEquivPrintClasses( p, pPars->fVeryVerbose, 0 );
}